

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O0

lzma_ret lzma_block_header_size(lzma_block *block)

{
  lzma_ret lVar1;
  uint32_t local_34;
  lzma_ret ret_;
  uint32_t add_2;
  size_t i;
  uint32_t local_20;
  uint32_t add_1;
  uint32_t add;
  uint32_t size;
  lzma_block *block_local;
  
  if (block->version < 2) {
    add_1 = 6;
    _add = block;
    if (block->compressed_size != 0xffffffffffffffff) {
      local_20 = lzma_vli_size(block->compressed_size);
      if ((local_20 == 0) || (_add->compressed_size == 0)) {
        return LZMA_PROG_ERROR;
      }
      add_1 = local_20 + add_1;
    }
    if (_add->uncompressed_size != 0xffffffffffffffff) {
      i._4_4_ = lzma_vli_size(_add->uncompressed_size);
      if (i._4_4_ == 0) {
        return LZMA_PROG_ERROR;
      }
      add_1 = i._4_4_ + add_1;
    }
    if ((_add->filters == (lzma_filter *)0x0) || (_add->filters->id == 0xffffffffffffffff)) {
      block_local._4_4_ = LZMA_PROG_ERROR;
    }
    else {
      for (_ret_ = 0; _add->filters[_ret_].id != 0xffffffffffffffff; _ret_ = _ret_ + 1) {
        if (_ret_ == 4) {
          return LZMA_PROG_ERROR;
        }
        lVar1 = lzma_filter_flags_size(&local_34,_add->filters + _ret_);
        if (lVar1 != LZMA_OK) {
          return lVar1;
        }
        add_1 = local_34 + add_1;
      }
      _add->header_size = add_1 + 3 & 0xfffffffc;
      block_local._4_4_ = LZMA_OK;
    }
  }
  else {
    block_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return block_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_size(lzma_block *block)
{
	if (block->version > 1)
		return LZMA_OPTIONS_ERROR;

	// Block Header Size + Block Flags + CRC32.
	uint32_t size = 1 + 1 + 4;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->compressed_size);
		if (add == 0 || block->compressed_size == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->uncompressed_size);
		if (add == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// List of Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	for (size_t i = 0; block->filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		// Don't allow too many filters.
		if (i == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		uint32_t add;
		return_if_error(lzma_filter_flags_size(&add,
				block->filters + i));

		size += add;
	}

	// Pad to a multiple of four bytes.
	block->header_size = (size + 3) & ~UINT32_C(3);

	// NOTE: We don't verify that the encoded size of the Block stays
	// within limits. This is because it is possible that we are called
	// with exaggerated Compressed Size (e.g. LZMA_VLI_MAX) to reserve
	// space for Block Header, and later called again with lower,
	// real values.

	return LZMA_OK;
}